

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::binary_escape_string(string *__return_storage_ptr__,string *string_to_escape)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  size_type sVar8;
  allocator local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  pointer local_240;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [88];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_240 = (string_to_escape->_M_dataplus)._M_p;
  sVar2 = string_to_escape->_M_string_length;
  local_248 = string_to_escape;
  for (sVar8 = 0; cVar7 = (char)__return_storage_ptr__, sVar2 != sVar8; sVar8 = sVar8 + 1) {
    bVar1 = local_240[sVar8];
    iVar4 = isprint((uint)bVar1);
    if (iVar4 == 0) {
      ::std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xffffffb5 | 8;
      ::std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::string((string *)&local_218,"\\x",&local_249);
      pcVar6 = "";
      if (code._M_string_length < 2) {
        pcVar6 = "0";
      }
      ::std::operator+(&local_1f8,&local_218,pcVar6);
      ::std::operator+(&local_1d8,&local_1f8,&code);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_218);
      ::std::__cxx11::string::~string((string *)&code);
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    }
    else if ((((bVar1 | 0x20) == 0x78) && (__return_storage_ptr__->_M_string_length != 0)) &&
            ((__return_storage_ptr__->_M_dataplus)._M_p
             [__return_storage_ptr__->_M_string_length - 1] == '\\')) {
      ::std::__cxx11::string::string((string *)&code,"\\x",(allocator *)&local_1d8);
      pcVar6 = "458";
      if (bVar1 == 0x78) {
        pcVar6 = "578";
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                       &code,pcVar6 + 1);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&stream);
      ::std::__cxx11::string::~string((string *)&code);
    }
    else {
      ::std::__cxx11::string::push_back(cVar7);
    }
  }
  bVar3 = ::std::operator!=(__return_storage_ptr__,local_248);
  if (bVar3) {
    while (lVar5 = ::std::__cxx11::string::find(cVar7,0x27), lVar5 != -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar5] = '\\';
      ::std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)(lVar5 + 1));
    }
    ::std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)0x0);
    ::std::__cxx11::string::push_back(cVar7);
    ::std::__cxx11::string::push_back(cVar7);
    ::std::__cxx11::string::push_back(cVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;
        } else if(c == 'x' || c == 'X') {
            // need to check for inadvertent binary sequences
            if(!escaped_string.empty() && escaped_string.back() == '\\') {
                escaped_string += std::string("\\x") + (c == 'x' ? "78" : "58");
            } else {
                escaped_string.push_back(c);
            }

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}